

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

Var __thiscall
Js::TypedArray<unsigned_char,_false,_false>::TypedXor
          (TypedArray<unsigned_char,_false,_false> *this,uint32 accessIndex,Var value)

{
  ArrayBufferBase *pAVar1;
  Type puVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint32 uVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  
  pAVar1 = (this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr;
  if (pAVar1 == (ArrayBufferBase *)0x0) {
LAB_00d6beda:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0xafa,"(GetArrayBuffer() && GetArrayBuffer()->GetBuffer())",
                                "GetArrayBuffer() && GetArrayBuffer()->GetBuffer()");
    if (!bVar4) goto LAB_00d6c0be;
    *puVar8 = 0;
  }
  else {
    iVar6 = (*(pAVar1->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
    if (CONCAT44(extraout_var,iVar6) == 0) goto LAB_00d6beda;
  }
  if ((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length <= accessIndex)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0xafa,"(accessIndex < GetLength())","accessIndex < GetLength()");
    if (!bVar4) goto LAB_00d6c0be;
    *puVar8 = 0;
  }
  puVar2 = (this->super_TypedArrayBase).buffer;
  if (((ulong)value & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)value & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)value & 0xffff000000000000) != 0x1000000000000) {
      uVar7 = JavascriptConversion::ToUInt32_Full
                        (value,(((((this->super_TypedArrayBase).super_ArrayBufferParent.
                                   super_ArrayObject.super_DynamicObject.super_RecyclableObject.type
                                  .ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                               scriptContext.ptr);
      value = (Var)(ulong)uVar7;
      goto LAB_00d6c098;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00d6c0be;
    *puVar8 = 0;
  }
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) {
LAB_00d6c0be:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
LAB_00d6c098:
  bVar5 = AtomicsOperations::Xor<unsigned_char>(puVar2 + accessIndex,(uchar)value);
  return (Var)((ulong)bVar5 | 0x1000000000000);
}

Assistant:

VTableValue Int8Array::DummyVirtualFunctionToHinderLinkerICF()
    {
        return VTableValue::VtableInt8Array;
    }